

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O3

void __thiscall
UCAFL::_uc_hook_cmplog(UCAFL *this,uint64_t cur_loc,uint64_t arg1,uint64_t arg2,uint32_t size)

{
  cmp_header cVar1;
  cmp_map *pcVar2;
  ulong uVar3;
  uint uVar4;
  cmp_header cVar5;
  ushort uVar6;
  ushort uVar7;
  
  pcVar2 = this->cmpmap_;
  uVar3 = cur_loc & 0xffff;
  if (size == 0x40) {
    uVar6 = 7;
  }
  else if (size == 0x20) {
    uVar6 = 3;
  }
  else {
    uVar6 = 0;
    if (size == 0x10) {
      uVar6 = 1;
    }
  }
  cVar1 = pcVar2->headers[uVar3];
  uVar4 = (uint)(ushort)cVar1;
  if (((ushort)cVar1 >> 0xb & 1) == 0) {
    uVar7 = (short)cVar1 + 1U & 0x3f;
    pcVar2->headers[uVar3] = (cmp_header)((ushort)cVar1 & 0xf7c0 | uVar7);
    if (uVar6 <= ((ushort)cVar1 >> 6 & 0x1f)) goto LAB_001037ac;
    cVar5 = (cmp_header)((ushort)cVar1 & 0xf000 | uVar7 | uVar6 << 6);
    uVar4 = (uint)(ushort)cVar1;
  }
  else {
    cVar5 = (cmp_header)(((ushort)cVar1 & 0xf000) + uVar6 * 0x40 + 1);
    uVar4 = 0;
  }
  pcVar2->headers[uVar3] = cVar5;
LAB_001037ac:
  *(uint64_t *)(pcVar2->log[0][uVar4 & 0x1f].unused + ((ulong)(uint)((int)uVar3 * 0x900) - 0x40)) =
       arg1;
  *(uint64_t *)(pcVar2->log[0][uVar4 & 0x1f].unused + ((ulong)(uint)((int)uVar3 * 0x900) - 0x20)) =
       arg2;
  return;
}

Assistant:

void _uc_hook_cmplog(uint64_t cur_loc, uint64_t arg1, uint64_t arg2, uint32_t size) {
        struct cmp_map* map = this->cmpmap_;

        uintptr_t k = (uintptr_t)cur_loc & (CMP_MAP_W - 1);
        uint32_t shape = 0;
        switch (size) {
            case 16:
                shape = 1;
                break;
            case 32:
                shape = 3;
                break;
            case 64:
                shape = 7;
                break;
            default:
                break;
        }

        // get hits count
        uint16_t hits;
        if (map->headers[k].type != CMP_TYPE_INS) {
            map->headers[k].type = CMP_TYPE_INS;
            map->headers[k].hits = 1;
            map->headers[k].shape = shape;
            hits = 0;
        } else {
            hits = map->headers[k].hits++;
            if (map->headers[k].shape < shape) {
                map->headers[k].shape = shape;
            }
        }

        hits &= CMP_MAP_H - 1;
        map->log[k][hits].v0 = arg1;
        map->log[k][hits].v1 = arg2;
    }